

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall
internalJSONNode::internalJSONNode(internalJSONNode *this,json_string *name_t,json_string *value_t)

{
  __type _Var1;
  bool bVar2;
  json_string *pjVar3;
  size_t *psVar4;
  ulong uVar5;
  undefined1 *puVar6;
  char *pcVar7;
  jsonChildren *pjVar8;
  json_string *pjVar9;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  json_string local_1a0;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  json_string local_158;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  json_string local_110;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  json_string local_c8;
  allocator local_a1;
  json_string local_a0;
  allocator local_79;
  json_string local_78;
  allocator local_51;
  json_string local_50;
  char local_2e;
  undefined1 local_2d;
  char lastchar;
  char firstchar;
  json_string *local_20;
  json_string *value_t_local;
  json_string *name_t_local;
  internalJSONNode *this_local;
  
  this->_type = '\0';
  local_20 = value_t;
  value_t_local = name_t;
  name_t_local = (json_string *)this;
  JSONWorker::FixString(&this->_name,name_t,&this->_name_encoded);
  this->_name_encoded = false;
  std::__cxx11::string::string((string *)&this->_string);
  this->_string_encoded = false;
  (this->_value)._number = 0.0;
  this->refcount = 1;
  this->fetched = false;
  pjVar3 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
  std::__cxx11::string::string((string *)&this->_comment,(string *)pjVar3);
  this->Children = (jsonChildren *)0x0;
  psVar4 = getCtorCounter();
  *psVar4 = *psVar4 + 1;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->_string,(string *)local_20);
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_20);
    pjVar3 = local_20;
    local_2d = *puVar6;
    std::__cxx11::string::length();
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pjVar3);
    pjVar3 = local_20;
    local_2e = *pcVar7;
    switch(local_2d) {
    case 0x22:
      if (local_2e == '\"') {
        this->_type = '\x01';
        SetFetched(this,false);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_50,"Unterminated quote",&local_51);
        JSONDebug::_JSON_FAIL(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        Nullify(this);
      }
      break;
    default:
      bVar2 = NumberToString::isNumeric(local_20);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        this->_type = '\x02';
        SetFetched(this,false);
      }
      else {
        pjVar3 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_1c0,pjVar3,local_20);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,pcVar7,&local_1c1);
        JSONDebug::_JSON_FAIL(&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        std::__cxx11::string::~string((string *)&local_1c0);
        Nullify(this);
      }
      break;
    case 0x46:
    case 0x66:
      pjVar9 = jsonSingletonCONST_FALSE::getValue_abi_cxx11_();
      _Var1 = std::operator==(pjVar3,pjVar9);
      if (((_Var1 ^ 0xffU) & 1) == 0) {
        (this->_value)._bool = false;
        this->_type = '\x03';
        SetFetched(this,true);
      }
      else {
        pjVar3 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_130,pjVar3,local_20);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_110,pcVar7,&local_131);
        JSONDebug::_JSON_FAIL(&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        std::__cxx11::string::~string((string *)&local_130);
        Nullify(this);
      }
      break;
    case 0x4e:
    case 0x6e:
      pjVar9 = jsonSingletonCONST_NULL::getValue_abi_cxx11_();
      _Var1 = std::operator==(pjVar3,pjVar9);
      if (((_Var1 ^ 0xffU) & 1) == 0) {
        this->_type = '\0';
        SetFetched(this,true);
      }
      else {
        pjVar3 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_178,pjVar3,local_20);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,pcVar7,&local_179);
        JSONDebug::_JSON_FAIL(&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        std::__cxx11::string::~string((string *)&local_178);
        Nullify(this);
      }
      break;
    case 0x54:
    case 0x74:
      pjVar9 = jsonSingletonCONST_TRUE::getValue_abi_cxx11_();
      _Var1 = std::operator==(pjVar3,pjVar9);
      if (((_Var1 ^ 0xffU) & 1) == 0) {
        (this->_value)._bool = true;
        this->_type = '\x03';
        SetFetched(this,true);
      }
      else {
        pjVar3 = jsonSingletonERROR_UNKNOWN_LITERAL::getValue_abi_cxx11_();
        std::operator+(&local_e8,pjVar3,local_20);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,pcVar7,&local_e9);
        JSONDebug::_JSON_FAIL(&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        std::__cxx11::string::~string((string *)&local_e8);
        Nullify(this);
      }
      break;
    case 0x5b:
      if (local_2e == ']') {
        this->_type = '\x04';
        pjVar8 = jsonChildren::newChildren();
        this->Children = pjVar8;
        SetFetched(this,false);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a0,"Missing ]",&local_a1);
        JSONDebug::_JSON_FAIL(&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        Nullify(this);
      }
      break;
    case 0x7b:
      if (local_2e == '}') {
        this->_type = '\x05';
        pjVar8 = jsonChildren::newChildren();
        this->Children = pjVar8;
        SetFetched(this,false);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_78,"Missing }",&local_79);
        JSONDebug::_JSON_FAIL(&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        Nullify(this);
      }
    }
  }
  else {
    this->_type = '\0';
    SetFetched(this,true);
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const json_string & name_t, const json_string & value_t) json_nothrow : _type(), _name_encoded(), _name(JSONWorker::FixString(name_t, NAME_ENCODED)), _string(), _string_encoded(), _value()
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(false)
    initializeComment(json_global(EMPTY_JSON_STRING))
    initializeChildren(0){

    LIBJSON_CTOR;

    #ifdef JSON_STRICT
	   JSON_ASSERT_SAFE(!value_t.empty(), JSON_TEXT("empty node"), Nullify(); return;);
    #else 
	   if (json_unlikely(value_t.empty())){
		  _type = JSON_NULL;
		  SetFetched(true);
		  return;
	   }
    #endif

    _string = value_t;

    const json_char firstchar = value_t[0];
    #if defined JSON_DEBUG || defined JSON_SAFE
	   const json_char lastchar = value_t[value_t.length() - 1];
    #endif

    switch (firstchar){
        case JSON_TEXT('\"'):  //a json_string literal, still escaped and with leading and trailing quotes
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT('\"'), JSON_TEXT("Unterminated quote"), Nullify(); return;);
            _type = JSON_STRING;
			SetFetchedFalseOrDo(FetchString());
            break;
        case JSON_TEXT('{'):  //a child node, or set of children
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT('}'), JSON_TEXT("Missing }"), Nullify(); return;);
            _type = JSON_NODE;
			CHILDREN = jsonChildren::newChildren();
			SetFetchedFalseOrDo(FetchNode());
            break;
        case JSON_TEXT('['):  //an array
            JSON_ASSERT_SAFE(lastchar == JSON_TEXT(']'), JSON_TEXT("Missing ]"), Nullify(); return;);
            _type = JSON_ARRAY;
			CHILDREN = jsonChildren::newChildren();
			SetFetchedFalseOrDo(FetchArray());
            break;
        LETTERCASE('t', 'T'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_TRUE), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _value._bool = true;
            _type = JSON_BOOL;
			SetFetched(true);
            break;
        LETTERCASE('f', 'F'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_FALSE), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _value._bool = false;
            _type = JSON_BOOL;
			SetFetched(true);
            break;
        LETTERCASE('n', 'N'):
            JSON_ASSERT_SAFE(value_t == json_global(CONST_NULL), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
            _type = JSON_NULL;
			SetFetched(true);
            break;
        default:
            JSON_ASSERT_SAFE(NumberToString::isNumeric(value_t), json_string(json_global(ERROR_UNKNOWN_LITERAL) + value_t).c_str(), Nullify(); return;);
			_type = JSON_NUMBER;
			SetFetchedFalseOrDo(FetchNumber());
            break;
    }
}